

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O0

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseNumber<0u,rapidjson::BasicIStreamWrapper<std::istream>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
          (GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
           *this,BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_> *is,
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          *handler)

{
  bool bVar1;
  Ch CVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_> *in_RDX;
  BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_> *in_RSI;
  GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *in_RDI;
  bool bVar6;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *pGVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  int p;
  NumberCharacter *decimal;
  size_t length;
  bool cont;
  int maxExp_1;
  int maxExp;
  bool expMinus;
  int exp;
  size_t decimalPosition;
  int expFrac;
  bool useDouble;
  int significandDigit;
  bool use64bit;
  uint64_t i64;
  uint i;
  bool minus;
  bool useNanOrInf;
  double d;
  size_t startOffset;
  NumberStream<rapidjson::BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>,_char,_false,_false>
  s;
  StreamLocalCopy<rapidjson::BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>,_0>
  copy;
  undefined8 in_stack_fffffffffffffca8;
  ParseErrorCode code;
  BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_> *in_stack_fffffffffffffcb0
  ;
  uint i_00;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *in_stack_fffffffffffffcb8;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *this_00;
  bool local_2a1;
  int local_294;
  int local_288;
  int local_280;
  ulong local_278;
  uint local_270;
  double local_268;
  NumberStream<rapidjson::BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>,_char,_false,_false>
  local_258;
  StreamLocalCopy<rapidjson::BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>,_0>
  local_250;
  BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_> *local_248;
  char local_229;
  NumberStream<rapidjson::BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>,_char,_false,_false>
  *local_228;
  undefined1 local_21a;
  char local_219;
  NumberStream<rapidjson::BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>,_char,_false,_false>
  *local_218;
  undefined1 local_20a;
  char local_209;
  NumberStream<rapidjson::BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>,_char,_false,_false>
  *local_208;
  undefined1 local_1fa;
  char local_1f9;
  NumberStream<rapidjson::BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>,_char,_false,_false>
  *local_1f8;
  undefined1 local_1ea;
  char local_1e9;
  NumberStream<rapidjson::BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>,_char,_false,_false>
  *local_1e8;
  undefined1 local_1da;
  char local_1d9;
  NumberStream<rapidjson::BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>,_char,_false,_false>
  *local_1d8;
  undefined1 local_1c9;
  NumberStream<rapidjson::BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>,_char,_false,_false>
  *local_1c8;
  NumberStream<rapidjson::BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>,_char,_false,_false>
  *local_1c0;
  NumberStream<rapidjson::BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>,_char,_false,_false>
  *local_1b8;
  NumberStream<rapidjson::BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>,_char,_false,_false>
  *local_1b0;
  NumberStream<rapidjson::BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>,_char,_false,_false>
  *local_1a8;
  NumberStream<rapidjson::BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>,_char,_false,_false>
  *local_1a0;
  NumberStream<rapidjson::BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>,_char,_false,_false>
  *local_198;
  NumberStream<rapidjson::BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>,_char,_false,_false>
  *local_190;
  NumberStream<rapidjson::BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>,_char,_false,_false>
  *local_188;
  NumberStream<rapidjson::BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>,_char,_false,_false>
  *local_180;
  NumberStream<rapidjson::BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>,_char,_false,_false>
  *local_178;
  NumberStream<rapidjson::BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>,_char,_false,_false>
  *local_170;
  NumberStream<rapidjson::BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>,_char,_false,_false>
  *local_168;
  NumberStream<rapidjson::BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>,_char,_false,_false>
  *local_160;
  NumberStream<rapidjson::BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>,_char,_false,_false>
  *local_158;
  NumberStream<rapidjson::BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>,_char,_false,_false>
  *local_150;
  NumberStream<rapidjson::BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>,_char,_false,_false>
  *local_148;
  NumberStream<rapidjson::BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>,_char,_false,_false>
  *local_140;
  NumberStream<rapidjson::BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>,_char,_false,_false>
  *local_138;
  NumberStream<rapidjson::BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>,_char,_false,_false>
  *local_130;
  NumberStream<rapidjson::BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>,_char,_false,_false>
  *local_128;
  NumberStream<rapidjson::BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>,_char,_false,_false>
  *local_120;
  NumberStream<rapidjson::BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>,_char,_false,_false>
  *local_118;
  NumberStream<rapidjson::BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>,_char,_false,_false>
  *local_110;
  NumberStream<rapidjson::BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>,_char,_false,_false>
  *local_108;
  NumberStream<rapidjson::BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>,_char,_false,_false>
  *local_100;
  NumberStream<rapidjson::BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>,_char,_false,_false>
  *local_f8;
  NumberStream<rapidjson::BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>,_char,_false,_false>
  *local_f0;
  NumberStream<rapidjson::BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>,_char,_false,_false>
  *local_e8;
  NumberStream<rapidjson::BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>,_char,_false,_false>
  *local_e0;
  NumberStream<rapidjson::BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>,_char,_false,_false>
  *local_d8;
  NumberStream<rapidjson::BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>,_char,_false,_false>
  *local_d0;
  NumberStream<rapidjson::BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>,_char,_false,_false>
  *local_c8;
  NumberStream<rapidjson::BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>,_char,_false,_false>
  *local_c0;
  NumberStream<rapidjson::BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>,_char,_false,_false>
  *local_b8;
  NumberStream<rapidjson::BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>,_char,_false,_false>
  *local_b0;
  NumberStream<rapidjson::BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>,_char,_false,_false>
  *local_a8;
  NumberStream<rapidjson::BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>,_char,_false,_false>
  *local_a0;
  NumberStream<rapidjson::BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>,_char,_false,_false>
  *local_98;
  NumberStream<rapidjson::BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>,_char,_false,_false>
  *local_90;
  NumberStream<rapidjson::BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>,_char,_false,_false>
  *local_88;
  NumberStream<rapidjson::BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>,_char,_false,_false>
  *local_80;
  NumberStream<rapidjson::BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>,_char,_false,_false>
  *local_78;
  NumberStream<rapidjson::BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>,_char,_false,_false>
  *local_70;
  NumberStream<rapidjson::BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>,_char,_false,_false>
  *local_68;
  NumberStream<rapidjson::BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>,_char,_false,_false>
  *local_60;
  NumberStream<rapidjson::BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>,_char,_false,_false>
  *local_58;
  NumberStream<rapidjson::BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>,_char,_false,_false>
  *local_50;
  NumberStream<rapidjson::BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>,_char,_false,_false>
  *local_48;
  NumberStream<rapidjson::BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>,_char,_false,_false>
  *local_40;
  NumberStream<rapidjson::BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>,_char,_false,_false>
  *local_38;
  NumberStream<rapidjson::BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>,_char,_false,_false>
  *local_30;
  NumberStream<rapidjson::BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>,_char,_false,_false>
  *local_28;
  NumberStream<rapidjson::BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>,_char,_false,_false>
  *local_20;
  NumberStream<rapidjson::BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>,_char,_false,_false>
  *local_18;
  NumberStream<rapidjson::BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>,_char,_false,_false>
  *local_10;
  NumberStream<rapidjson::BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>,_char,_false,_false>
  *local_8;
  
  local_248 = in_RDX;
  internal::
  StreamLocalCopy<rapidjson::BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>,_0>
  ::StreamLocalCopy(&local_250,in_RSI);
  GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
  NumberStream<rapidjson::BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>,_char,_false,_false>
  ::NumberStream(&local_258,in_RDI,local_250.s);
  GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
  NumberStream<rapidjson::BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>,_char,_false,_false>
  ::Tell((NumberStream<rapidjson::BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>,_char,_false,_false>
          *)0x3d8e0e);
  local_268 = 0.0;
  local_1d8 = &local_258;
  local_1d9 = '-';
  local_1c8 = local_1d8;
  CVar2 = BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Peek
                    (local_258.is);
  bVar6 = CVar2 == local_1d9;
  if (bVar6) {
    local_50 = local_1d8;
    BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Take
              (in_stack_fffffffffffffcb0);
  }
  local_270 = 0;
  local_278 = 0;
  bVar5 = false;
  local_280 = 0;
  local_a8 = &local_258;
  local_1c9 = bVar6;
  CVar2 = BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Peek
                    (local_258.is);
  if (CVar2 == '0') {
    local_270 = 0;
    local_58 = &local_258;
    BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Take
              (in_stack_fffffffffffffcb0);
  }
  else {
    local_b0 = &local_258;
    CVar2 = BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Peek
                      (local_258.is);
    bVar3 = false;
    if ('0' < CVar2) {
      local_b8 = &local_258;
      CVar2 = BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Peek
                        (local_258.is);
      bVar3 = CVar2 < ':';
    }
    if (bVar3) {
      local_60 = &local_258;
      CVar2 = BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Take
                        (in_stack_fffffffffffffcb0);
      local_270 = (int)CVar2 - 0x30;
      if (!bVar6) {
        do {
          local_d8 = &local_258;
          CVar2 = BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Peek
                            (local_258.is);
          bVar3 = false;
          if ('/' < CVar2) {
            local_e0 = &local_258;
            CVar2 = BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Peek
                              (local_258.is);
            bVar3 = CVar2 < ':';
          }
          if (!bVar3) goto LAB_003d9308;
          if (0x19999998 < local_270) {
            bVar3 = true;
            if (local_270 == 0x19999999) {
              local_e8 = &local_258;
              CVar2 = BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Peek
                                (local_258.is);
              bVar3 = '5' < CVar2;
            }
            if (bVar3) goto LAB_003d9240;
          }
          local_70 = &local_258;
          CVar2 = BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Take
                            (in_stack_fffffffffffffcb0);
          local_270 = local_270 * 10 + CVar2 + -0x30;
          local_280 = local_280 + 1;
        } while( true );
      }
      do {
        local_c0 = &local_258;
        CVar2 = BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Peek
                          (local_258.is);
        bVar3 = false;
        if ('/' < CVar2) {
          local_c8 = &local_258;
          CVar2 = BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Peek
                            (local_258.is);
          bVar3 = CVar2 < ':';
        }
        if (!bVar3) goto LAB_003d9308;
        if (0xccccccb < local_270) {
          bVar3 = true;
          if (local_270 == 0xccccccc) {
            local_d0 = &local_258;
            CVar2 = BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Peek
                              (local_258.is);
            bVar3 = '8' < CVar2;
          }
          if (bVar3) goto LAB_003d90dd;
        }
        local_68 = &local_258;
        CVar2 = BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Take
                          (in_stack_fffffffffffffcb0);
        local_270 = local_270 * 10 + CVar2 + -0x30;
        local_280 = local_280 + 1;
      } while( true );
    }
    GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
    NumberStream<rapidjson::BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>,_char,_false,_false>
    ::Tell((NumberStream<rapidjson::BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>,_char,_false,_false>
            *)0x3d92cd);
    GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
    SetParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                   *)in_stack_fffffffffffffcb0,
                  (ParseErrorCode)((ulong)in_stack_fffffffffffffca8 >> 0x20),0x3d92e2);
    bVar3 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
            HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                           *)0x3d92f1);
    if (bVar3) {
      return;
    }
  }
LAB_003d9308:
  bVar3 = false;
  if (bVar5) {
    if (!bVar6) {
      do {
        local_108 = &local_258;
        CVar2 = BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Peek
                          (local_258.is);
        bVar4 = false;
        if ('/' < CVar2) {
          local_110 = &local_258;
          CVar2 = BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Peek
                            (local_258.is);
          bVar4 = CVar2 < ':';
        }
        if (!bVar4) goto LAB_003d963b;
        if (0x1999999999999998 < local_278) {
          bVar4 = true;
          if (local_278 == 0x1999999999999999) {
            local_118 = &local_258;
            CVar2 = BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Peek
                              (local_258.is);
            bVar4 = '5' < CVar2;
          }
          if (bVar4) goto LAB_003d9599;
        }
        local_80 = &local_258;
        CVar2 = BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Take
                          (in_stack_fffffffffffffcb0);
        local_278 = local_278 * 10 + (ulong)((int)CVar2 - 0x30);
        local_280 = local_280 + 1;
      } while( true );
    }
    do {
      local_f0 = &local_258;
      CVar2 = BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Peek
                        (local_258.is);
      bVar4 = false;
      if ('/' < CVar2) {
        local_f8 = &local_258;
        CVar2 = BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Peek
                          (local_258.is);
        bVar4 = CVar2 < ':';
      }
      if (!bVar4) break;
      if (0xccccccccccccccb < local_278) {
        bVar4 = true;
        if (local_278 == 0xccccccccccccccc) {
          local_100 = &local_258;
          CVar2 = BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Peek
                            (local_258.is);
          bVar4 = '8' < CVar2;
        }
        if (bVar4) goto LAB_003d9411;
      }
      local_78 = &local_258;
      CVar2 = BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Take
                        (in_stack_fffffffffffffcb0);
      local_278 = local_278 * 10 + (ulong)((int)CVar2 - 0x30);
      local_280 = local_280 + 1;
    } while( true );
  }
LAB_003d963b:
  if (bVar3) {
    while( true ) {
      local_120 = &local_258;
      CVar2 = BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Peek
                        (local_258.is);
      bVar4 = false;
      if ('/' < CVar2) {
        local_128 = &local_258;
        CVar2 = BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Peek
                          (local_258.is);
        bVar4 = CVar2 < ':';
      }
      if (!bVar4) break;
      local_88 = &local_258;
      CVar2 = BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Take
                        (in_stack_fffffffffffffcb0);
      local_268 = local_268 * 10.0 + (double)(CVar2 + -0x30);
    }
  }
  local_288 = 0;
  local_1e8 = &local_258;
  local_1e9 = '.';
  local_1c0 = local_1e8;
  CVar2 = BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Peek
                    (local_258.is);
  local_1da = CVar2 == local_1e9;
  if ((bool)local_1da) {
    local_48 = local_1e8;
    BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Take
              (in_stack_fffffffffffffcb0);
    GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
    NumberStream<rapidjson::BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>,_char,_false,_false>
    ::Length(&local_258);
    local_130 = &local_258;
    CVar2 = BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Peek
                      (local_258.is);
    bVar4 = false;
    if ('/' < CVar2) {
      local_138 = &local_258;
      CVar2 = BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Peek
                        (local_258.is);
      bVar4 = CVar2 < ':';
    }
    if (!bVar4) {
      GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
      NumberStream<rapidjson::BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>,_char,_false,_false>
      ::Tell((NumberStream<rapidjson::BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>,_char,_false,_false>
              *)0x3d984c);
      GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
      SetParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                     *)in_stack_fffffffffffffcb0,
                    (ParseErrorCode)((ulong)in_stack_fffffffffffffca8 >> 0x20),0x3d9861);
      bVar4 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
              HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                             *)0x3d9870);
      if (bVar4) {
        return;
      }
    }
    if (!bVar3) {
      if (!bVar5) {
        local_278 = (ulong)local_270;
      }
      while( true ) {
        local_140 = &local_258;
        CVar2 = BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Peek
                          (local_258.is);
        bVar3 = false;
        if ('/' < CVar2) {
          local_148 = &local_258;
          CVar2 = BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Peek
                            (local_258.is);
          bVar3 = CVar2 < ':';
        }
        if ((!bVar3) || (0x1fffffffffffff < local_278)) break;
        local_90 = &local_258;
        CVar2 = BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Take
                          (in_stack_fffffffffffffcb0);
        local_278 = local_278 * 10 + (ulong)((int)CVar2 - 0x30);
        local_288 = local_288 + -1;
        if (local_278 != 0) {
          local_280 = local_280 + 1;
        }
      }
      auVar11._8_4_ = (int)(local_278 >> 0x20);
      auVar11._0_8_ = local_278;
      auVar11._12_4_ = 0x45300000;
      local_268 = (auVar11._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)local_278) - 4503599627370496.0);
      bVar3 = true;
    }
    while( true ) {
      local_150 = &local_258;
      CVar2 = BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Peek
                        (local_258.is);
      bVar4 = false;
      if ('/' < CVar2) {
        local_158 = &local_258;
        CVar2 = BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Peek
                          (local_258.is);
        bVar4 = CVar2 < ':';
      }
      if (!bVar4) break;
      if (local_280 < 0x11) {
        local_98 = &local_258;
        CVar2 = BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Take
                          (in_stack_fffffffffffffcb0);
        local_268 = local_268 * 10.0 + (double)(CVar2 + -0x30);
        local_288 = local_288 + -1;
        if (0.0 < local_268) {
          local_280 = local_280 + 1;
        }
      }
      else {
        local_a0 = &local_258;
        BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Take
                  (in_stack_fffffffffffffcb0);
      }
    }
  }
  else {
    GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
    NumberStream<rapidjson::BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>,_char,_false,_false>
    ::Length(&local_258);
  }
  local_1f8 = &local_258;
  local_1f9 = 'e';
  local_1b8 = local_1f8;
  CVar2 = BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Peek
                    (local_258.is);
  local_1ea = CVar2 == local_1f9;
  if ((bool)local_1ea) {
    local_40 = local_1f8;
    BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Take
              (in_stack_fffffffffffffcb0);
  }
  else {
    local_208 = &local_258;
    local_209 = 'E';
    local_1b0 = local_208;
    CVar2 = BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Peek
                      (local_258.is);
    code = (ParseErrorCode)((ulong)in_stack_fffffffffffffca8 >> 0x20);
    local_1fa = CVar2 == local_209;
    if (!(bool)local_1fa) goto LAB_003da1bf;
    local_38 = local_208;
    BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Take
              (in_stack_fffffffffffffcb0);
  }
  if (!bVar3) {
    bVar3 = true;
  }
  local_218 = &local_258;
  local_219 = '+';
  local_1a8 = local_218;
  CVar2 = BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Peek
                    (local_258.is);
  local_20a = CVar2 == local_219;
  if ((bool)local_20a) {
    local_30 = local_218;
    BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Take
              (in_stack_fffffffffffffcb0);
    bVar4 = false;
  }
  else {
    local_228 = &local_258;
    local_229 = '-';
    local_1a0 = local_228;
    CVar2 = BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Peek
                      (local_258.is);
    local_21a = CVar2 == local_229;
    bVar4 = (bool)local_21a;
    if ((bool)local_21a) {
      local_28 = local_228;
      BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Take
                (in_stack_fffffffffffffcb0);
    }
  }
  local_160 = &local_258;
  CVar2 = BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Peek
                    (local_258.is);
  bVar1 = false;
  if ('/' < CVar2) {
    local_168 = &local_258;
    CVar2 = BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Peek
                      (local_258.is);
    bVar1 = CVar2 < ':';
  }
  code = (ParseErrorCode)((ulong)in_stack_fffffffffffffca8 >> 0x20);
  if (bVar1) {
    local_8 = &local_258;
    CVar2 = BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Take
                      (in_stack_fffffffffffffcb0);
    local_294 = CVar2 + -0x30;
    if (bVar4) {
      while( true ) {
        local_170 = &local_258;
        CVar2 = BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Peek
                          (local_258.is);
        bVar4 = false;
        if ('/' < CVar2) {
          local_178 = &local_258;
          CVar2 = BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Peek
                            (local_258.is);
          bVar4 = CVar2 < ':';
        }
        code = (ParseErrorCode)((ulong)in_stack_fffffffffffffca8 >> 0x20);
        if (!bVar4) break;
        local_10 = &local_258;
        CVar2 = BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Take
                          (in_stack_fffffffffffffcb0);
        local_294 = local_294 * 10 + CVar2 + -0x30;
        if ((local_288 + 0x7ffffff7) / 10 < local_294) {
          while( true ) {
            local_180 = &local_258;
            CVar2 = BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Peek
                              (local_258.is);
            bVar4 = false;
            if ('/' < CVar2) {
              local_188 = &local_258;
              CVar2 = BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Peek
                                (local_258.is);
              bVar4 = CVar2 < ':';
            }
            if (!bVar4) break;
            local_18 = &local_258;
            BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Take
                      (in_stack_fffffffffffffcb0);
          }
        }
      }
    }
    else {
      while( true ) {
        local_190 = &local_258;
        CVar2 = BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Peek
                          (local_258.is);
        bVar4 = false;
        if ('/' < CVar2) {
          local_198 = &local_258;
          CVar2 = BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Peek
                            (local_258.is);
          bVar4 = CVar2 < ':';
        }
        code = (ParseErrorCode)((ulong)in_stack_fffffffffffffca8 >> 0x20);
        if (!bVar4) break;
        local_20 = &local_258;
        CVar2 = BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Take
                          (in_stack_fffffffffffffcb0);
        local_294 = local_294 * 10 + CVar2 + -0x30;
        if (0x134 - local_288 < local_294) {
          GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
          SetParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                         *)in_stack_fffffffffffffcb0,
                        (ParseErrorCode)((ulong)in_stack_fffffffffffffca8 >> 0x20),0x3da12c);
          bVar4 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                  ::HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                                   *)0x3da13b);
          if (bVar4) {
            return;
          }
        }
      }
    }
  }
  else {
    GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
    NumberStream<rapidjson::BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>,_char,_false,_false>
    ::Tell((NumberStream<rapidjson::BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>,_char,_false,_false>
            *)0x3da16a);
    GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
    SetParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                   *)in_stack_fffffffffffffcb0,code,0x3da17f);
    bVar4 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
            HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                           *)0x3da18e);
    if (bVar4) {
      return;
    }
  }
LAB_003da1bf:
  GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
  NumberStream<rapidjson::BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>,_char,_false,_false>
  ::Length(&local_258);
  GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
  NumberStream<rapidjson::BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>,_char,_false,_false>
  ::Pop(&local_258);
  if (bVar3) {
    pGVar7 = (GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
              *)internal::StrtodNormalPrecision((double)in_stack_fffffffffffffcb0,code);
    this_00 = pGVar7;
    dVar8 = std::numeric_limits<double>::max();
    if (dVar8 < (double)this_00) {
      GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
      SetParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                     *)in_stack_fffffffffffffcb0,code,0x3da273);
      bVar5 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
              HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                             *)0x3da282);
      if (bVar5) {
        return;
      }
    }
    if (bVar6) {
      pGVar7 = (GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                *)((ulong)pGVar7 ^ 0x8000000000000000);
    }
    code = (ParseErrorCode)((ulong)pGVar7 >> 0x20);
    local_2a1 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                ::Double(this_00,(double)local_248);
    in_stack_fffffffffffffcb0 = local_248;
  }
  else if (bVar5) {
    if (bVar6) {
      local_2a1 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                  ::Int64(in_stack_fffffffffffffcb8,(int64_t)in_stack_fffffffffffffcb0);
    }
    else {
      local_2a1 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                  ::Uint64(in_stack_fffffffffffffcb8,(uint64_t)in_stack_fffffffffffffcb0);
    }
  }
  else {
    i_00 = (uint)((ulong)in_stack_fffffffffffffcb0 >> 0x20);
    if (bVar6) {
      local_2a1 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                  ::Int(in_stack_fffffffffffffcb8,i_00);
    }
    else {
      local_2a1 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                  ::Uint(in_stack_fffffffffffffcb8,i_00);
    }
  }
  if (((local_2a1 ^ 0xffU) & 1) != 0) {
    GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
    SetParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                   *)in_stack_fffffffffffffcb0,code,0x3da40d);
    GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
    HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                   *)0x3da41c);
  }
  return;
LAB_003d9240:
  local_278 = (ulong)local_270;
  bVar5 = true;
  goto LAB_003d9308;
LAB_003d90dd:
  local_278 = (ulong)local_270;
  bVar5 = true;
  goto LAB_003d9308;
LAB_003d9599:
  auVar10._8_4_ = (int)(local_278 >> 0x20);
  auVar10._0_8_ = local_278;
  auVar10._12_4_ = 0x45300000;
  local_268 = (auVar10._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)local_278) - 4503599627370496.0);
  bVar3 = true;
  goto LAB_003d963b;
LAB_003d9411:
  auVar9._8_4_ = (int)(local_278 >> 0x20);
  auVar9._0_8_ = local_278;
  auVar9._12_4_ = 0x45300000;
  local_268 = (auVar9._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)local_278) - 4503599627370496.0);
  bVar3 = true;
  goto LAB_003d963b;
}

Assistant:

void ParseNumber(InputStream& is, Handler& handler) {
        typedef typename internal::SelectIf<internal::BoolType<(parseFlags & kParseNumbersAsStringsFlag) != 0>, typename TargetEncoding::Ch, char>::Type NumberCharacter;

        internal::StreamLocalCopy<InputStream> copy(is);
        NumberStream<InputStream, NumberCharacter,
            ((parseFlags & kParseNumbersAsStringsFlag) != 0) ?
                ((parseFlags & kParseInsituFlag) == 0) :
                ((parseFlags & kParseFullPrecisionFlag) != 0),
            (parseFlags & kParseNumbersAsStringsFlag) != 0 &&
                (parseFlags & kParseInsituFlag) == 0> s(*this, copy.s);

        size_t startOffset = s.Tell();
        double d = 0.0;
        bool useNanOrInf = false;

        // Parse minus
        bool minus = Consume(s, '-');

        // Parse int: zero / ( digit1-9 *DIGIT )
        unsigned i = 0;
        uint64_t i64 = 0;
        bool use64bit = false;
        int significandDigit = 0;
        if (RAPIDJSON_UNLIKELY(s.Peek() == '0')) {
            i = 0;
            s.TakePush();
        }
        else if (RAPIDJSON_LIKELY(s.Peek() >= '1' && s.Peek() <= '9')) {
            i = static_cast<unsigned>(s.TakePush() - '0');

            if (minus)
                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                    if (RAPIDJSON_UNLIKELY(i >= 214748364)) { // 2^31 = 2147483648
                        if (RAPIDJSON_LIKELY(i != 214748364 || s.Peek() > '8')) {
                            i64 = i;
                            use64bit = true;
                            break;
                        }
                    }
                    i = i * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
            else
                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                    if (RAPIDJSON_UNLIKELY(i >= 429496729)) { // 2^32 - 1 = 4294967295
                        if (RAPIDJSON_LIKELY(i != 429496729 || s.Peek() > '5')) {
                            i64 = i;
                            use64bit = true;
                            break;
                        }
                    }
                    i = i * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
        }
        // Parse NaN or Infinity here
        else if ((parseFlags & kParseNanAndInfFlag) && RAPIDJSON_LIKELY((s.Peek() == 'I' || s.Peek() == 'N'))) {
            if (Consume(s, 'N')) {
                if (Consume(s, 'a') && Consume(s, 'N')) {
                    d = std::numeric_limits<double>::quiet_NaN();
                    useNanOrInf = true;
                }
            }
            else if (RAPIDJSON_LIKELY(Consume(s, 'I'))) {
                if (Consume(s, 'n') && Consume(s, 'f')) {
                    d = (minus ? -std::numeric_limits<double>::infinity() : std::numeric_limits<double>::infinity());
                    useNanOrInf = true;

                    if (RAPIDJSON_UNLIKELY(s.Peek() == 'i' && !(Consume(s, 'i') && Consume(s, 'n')
                                                                && Consume(s, 'i') && Consume(s, 't') && Consume(s, 'y')))) {
                        RAPIDJSON_PARSE_ERROR(kParseErrorValueInvalid, s.Tell());
                    }
                }
            }

            if (RAPIDJSON_UNLIKELY(!useNanOrInf)) {
                RAPIDJSON_PARSE_ERROR(kParseErrorValueInvalid, s.Tell());
            }
        }
        else
            RAPIDJSON_PARSE_ERROR(kParseErrorValueInvalid, s.Tell());

        // Parse 64bit int
        bool useDouble = false;
        if (use64bit) {
            if (minus)
                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                     if (RAPIDJSON_UNLIKELY(i64 >= RAPIDJSON_UINT64_C2(0x0CCCCCCC, 0xCCCCCCCC))) // 2^63 = 9223372036854775808
                        if (RAPIDJSON_LIKELY(i64 != RAPIDJSON_UINT64_C2(0x0CCCCCCC, 0xCCCCCCCC) || s.Peek() > '8')) {
                            d = static_cast<double>(i64);
                            useDouble = true;
                            break;
                        }
                    i64 = i64 * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
            else
                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                    if (RAPIDJSON_UNLIKELY(i64 >= RAPIDJSON_UINT64_C2(0x19999999, 0x99999999))) // 2^64 - 1 = 18446744073709551615
                        if (RAPIDJSON_LIKELY(i64 != RAPIDJSON_UINT64_C2(0x19999999, 0x99999999) || s.Peek() > '5')) {
                            d = static_cast<double>(i64);
                            useDouble = true;
                            break;
                        }
                    i64 = i64 * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
        }

        // Force double for big integer
        if (useDouble) {
            while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                d = d * 10 + (s.TakePush() - '0');
            }
        }

        // Parse frac = decimal-point 1*DIGIT
        int expFrac = 0;
        size_t decimalPosition;
        if (!useNanOrInf && Consume(s, '.')) {
            decimalPosition = s.Length();

            if (RAPIDJSON_UNLIKELY(!(s.Peek() >= '0' && s.Peek() <= '9')))
                RAPIDJSON_PARSE_ERROR(kParseErrorNumberMissFraction, s.Tell());

            if (!useDouble) {
#if RAPIDJSON_64BIT
                // Use i64 to store significand in 64-bit architecture
                if (!use64bit)
                    i64 = i;

                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                    if (i64 > RAPIDJSON_UINT64_C2(0x1FFFFF, 0xFFFFFFFF)) // 2^53 - 1 for fast path
                        break;
                    else {
                        i64 = i64 * 10 + static_cast<unsigned>(s.TakePush() - '0');
                        --expFrac;
                        if (i64 != 0)
                            significandDigit++;
                    }
                }

                d = static_cast<double>(i64);
#else
                // Use double to store significand in 32-bit architecture
                d = static_cast<double>(use64bit ? i64 : i);
#endif
                useDouble = true;
            }

            while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                if (significandDigit < 17) {
                    d = d * 10.0 + (s.TakePush() - '0');
                    --expFrac;
                    if (RAPIDJSON_LIKELY(d > 0.0))
                        significandDigit++;
                }
                else
                    s.TakePush();
            }
        }
        else
            decimalPosition = s.Length(); // decimal position at the end of integer.

        // Parse exp = e [ minus / plus ] 1*DIGIT
        int exp = 0;
        if (!useNanOrInf && (Consume(s, 'e') || Consume(s, 'E'))) {
            if (!useDouble) {
                d = static_cast<double>(use64bit ? i64 : i);
                useDouble = true;
            }

            bool expMinus = false;
            if (Consume(s, '+'))
                ;
            else if (Consume(s, '-'))
                expMinus = true;

            if (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                exp = static_cast<int>(s.Take() - '0');
                if (expMinus) {
                    // (exp + expFrac) must not underflow int => we're detecting when -exp gets
                    // dangerously close to INT_MIN (a pessimistic next digit 9 would push it into
                    // underflow territory):
                    //
                    //        -(exp * 10 + 9) + expFrac >= INT_MIN
                    //   <=>  exp <= (expFrac - INT_MIN - 9) / 10
                    RAPIDJSON_ASSERT(expFrac <= 0);
                    int maxExp = (expFrac + 2147483639) / 10;

                    while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                        exp = exp * 10 + static_cast<int>(s.Take() - '0');
                        if (RAPIDJSON_UNLIKELY(exp > maxExp)) {
                            while (RAPIDJSON_UNLIKELY(s.Peek() >= '0' && s.Peek() <= '9'))  // Consume the rest of exponent
                                s.Take();
                        }
                    }
                }
                else {  // positive exp
                    int maxExp = 308 - expFrac;
                    while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                        exp = exp * 10 + static_cast<int>(s.Take() - '0');
                        if (RAPIDJSON_UNLIKELY(exp > maxExp))
                            RAPIDJSON_PARSE_ERROR(kParseErrorNumberTooBig, startOffset);
                    }
                }
            }
            else
                RAPIDJSON_PARSE_ERROR(kParseErrorNumberMissExponent, s.Tell());

            if (expMinus)
                exp = -exp;
        }

        // Finish parsing, call event according to the type of number.
        bool cont = true;

        if (parseFlags & kParseNumbersAsStringsFlag) {
            if (parseFlags & kParseInsituFlag) {
                s.Pop();  // Pop stack no matter if it will be used or not.
                typename InputStream::Ch* head = is.PutBegin();
                const size_t length = s.Tell() - startOffset;
                RAPIDJSON_ASSERT(length <= 0xFFFFFFFF);
                // unable to insert the \0 character here, it will erase the comma after this number
                const typename TargetEncoding::Ch* const str = reinterpret_cast<typename TargetEncoding::Ch*>(head);
                cont = handler.RawNumber(str, SizeType(length), false);
            }
            else {
                SizeType numCharsToCopy = static_cast<SizeType>(s.Length());
                GenericStringStream<UTF8<NumberCharacter> > srcStream(s.Pop());
                StackStream<typename TargetEncoding::Ch> dstStream(stack_);
                while (numCharsToCopy--) {
                    Transcoder<UTF8<typename TargetEncoding::Ch>, TargetEncoding>::Transcode(srcStream, dstStream);
                }
                dstStream.Put('\0');
                const typename TargetEncoding::Ch* str = dstStream.Pop();
                const SizeType length = static_cast<SizeType>(dstStream.Length()) - 1;
                cont = handler.RawNumber(str, SizeType(length), true);
            }
        }
        else {
           size_t length = s.Length();
           const NumberCharacter* decimal = s.Pop();  // Pop stack no matter if it will be used or not.

           if (useDouble) {
               int p = exp + expFrac;
               if (parseFlags & kParseFullPrecisionFlag)
                   d = internal::StrtodFullPrecision(d, p, decimal, length, decimalPosition, exp);
               else
                   d = internal::StrtodNormalPrecision(d, p);

               // Use > max, instead of == inf, to fix bogus warning -Wfloat-equal
               if (d > (std::numeric_limits<double>::max)()) {
                   // Overflow
                   // TODO: internal::StrtodX should report overflow (or underflow)
                   RAPIDJSON_PARSE_ERROR(kParseErrorNumberTooBig, startOffset);
               }

               cont = handler.Double(minus ? -d : d);
           }
           else if (useNanOrInf) {
               cont = handler.Double(d);
           }
           else {
               if (use64bit) {
                   if (minus)
                       cont = handler.Int64(static_cast<int64_t>(~i64 + 1));
                   else
                       cont = handler.Uint64(i64);
               }
               else {
                   if (minus)
                       cont = handler.Int(static_cast<int32_t>(~i + 1));
                   else
                       cont = handler.Uint(i);
               }
           }
        }
        if (RAPIDJSON_UNLIKELY(!cont))
            RAPIDJSON_PARSE_ERROR(kParseErrorTermination, startOffset);
    }